

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_InitFuncScoped
               (FrameDisplay *pScope,PropertyId propertyId,Var newValue,Var defaultInstance,
               ScriptContext *scriptContext)

{
  bool bVar1;
  ushort uVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  uint index;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  uVar2 = pScope->length;
  index = 0;
  do {
    if (uVar2 == index) {
      bVar5 = TaggedNumber::Is(defaultInstance);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcf9,"(!TaggedNumber::Is(defaultInstance))",
                                    "Root object is an int or tagged float?");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      pRVar9 = VarTo<Js::RecyclableObject>(defaultInstance);
      iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x20])(pRVar9,(ulong)(uint)propertyId,newValue);
      goto LAB_0099bbb9;
    }
    plVar7 = (long *)FrameDisplay::GetItem(pScope,index);
    iVar6 = (**(code **)(*plVar7 + 0x100))(plVar7,propertyId,newValue);
    index = index + 1;
  } while (iVar6 == 0);
  iVar6 = 1;
LAB_0099bbb9:
  pTVar3->noJsReentrancy = bVar1;
  return iVar6;
}

Assistant:

BOOL JavascriptOperators::OP_InitFuncScoped(FrameDisplay *pScope, PropertyId propertyId, Var newValue, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitFuncScoped, reentrancylock, scriptContext->GetThreadContext());
        int i;
        int length = pScope->GetLength();
        DynamicObject *obj;

        for (i = 0; i < length; i++)
        {
            obj = (DynamicObject*)pScope->GetItem(i);

            if (obj->InitFuncScoped(propertyId, newValue))
            {
                return TRUE;
            }
        }

        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        return VarTo<RecyclableObject>(defaultInstance)->InitFuncScoped(propertyId, newValue);
        JIT_HELPER_END(Op_InitFuncScoped);
    }